

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

ostream * __thiscall smf::Option_register::print(Option_register *this,ostream *out)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,"definition:\t");
  poVar1 = std::operator<<(poVar1,(string *)this);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"description:\t");
  poVar1 = std::operator<<(poVar1,(string *)&this->m_description);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"defaultOption:\t");
  poVar1 = std::operator<<(poVar1,(string *)&this->m_defaultOption);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"modifiedOption:\t");
  poVar1 = std::operator<<(poVar1,(string *)&this->m_modifiedOption);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"modifiedQ:\t\t");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"type:\t\t");
  poVar1 = std::operator<<(poVar1,this->m_type);
  std::endl<char,std::char_traits<char>>(poVar1);
  return out;
}

Assistant:

std::ostream& Option_register::print(std::ostream& out) {
	out << "definition:\t"     << m_definition     << std::endl;
	out << "description:\t"    << m_description    << std::endl;
	out << "defaultOption:\t"  << m_defaultOption  << std::endl;
	out << "modifiedOption:\t" << m_modifiedOption << std::endl;
	out << "modifiedQ:\t\t"    << m_modifiedQ      << std::endl;
	out << "type:\t\t"         << m_type           << std::endl;
	return out;
}